

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPListener.cpp
# Opt level: O0

void __thiscall hwnet::TCPListener::Do(TCPListener *this)

{
  int __args_1;
  bool bVar1;
  enable_shared_from_this<hwnet::TCPListener> local_e8;
  int local_d4;
  lock_guard<std::mutex> local_d0;
  lock_guard<std::mutex> guard;
  Addr local_b8;
  enable_shared_from_this<hwnet::TCPListener> local_40;
  int local_30;
  int local_2c;
  int err;
  int localVer;
  int fd_;
  socklen_t len;
  sockaddr addr_;
  TCPListener *this_local;
  
  addr_.sa_data._6_8_ = this;
  do {
    localVer = Addr::AddrLen(&this->addr);
    std::mutex::lock(&this->mtx);
    local_2c = this->readableVer;
    std::mutex::unlock(&this->mtx);
    local_30 = accept(this,(int)&err,(sockaddr *)&fd_,(socklen_t *)&localVer);
    if (local_30 == 0) {
      std::enable_shared_from_this<hwnet::TCPListener>::shared_from_this(&local_40);
      __args_1 = err;
      Addr::MakeBySockAddr(&local_b8,(sockaddr *)&fd_,localVer);
      std::function<void_(const_std::shared_ptr<hwnet::TCPListener>_&,_int,_const_hwnet::Addr_&)>::
      operator()(&this->onNewConn_,(shared_ptr<hwnet::TCPListener> *)&local_40,__args_1,&local_b8);
      std::shared_ptr<hwnet::TCPListener>::~shared_ptr((shared_ptr<hwnet::TCPListener> *)&local_40);
    }
    else if (local_30 == 0xb) {
      std::lock_guard<std::mutex>::lock_guard(&local_d0,&this->mtx);
      if (local_2c == this->readableVer) {
        this->doing = false;
        local_d4 = 2;
      }
      else {
        local_d4 = 0;
      }
      std::lock_guard<std::mutex>::~lock_guard(&local_d0);
      if (local_d4 != 0) {
        return;
      }
    }
    else {
      bVar1 = std::operator!=((nullptr_t)0x0,&this->onError_);
      if (bVar1) {
        std::enable_shared_from_this<hwnet::TCPListener>::shared_from_this(&local_e8);
        std::function<void_(const_std::shared_ptr<hwnet::TCPListener>_&,_int)>::operator()
                  (&this->onError_,(shared_ptr<hwnet::TCPListener> *)&local_e8,local_30);
        std::shared_ptr<hwnet::TCPListener>::~shared_ptr
                  ((shared_ptr<hwnet::TCPListener> *)&local_e8);
        return;
      }
    }
    bVar1 = std::atomic<bool>::load(&this->stop,memory_order_seq_cst);
    if (bVar1) {
      return;
    }
  } while( true );
}

Assistant:

void TCPListener::Do() {
	for(;;) {
		struct sockaddr addr_;
		socklen_t len = this->addr.AddrLen();
		int       fd_;
		this->mtx.lock();		
		auto localVer = this->readableVer;
		this->mtx.unlock();
		auto err = this->accept(&fd_,&addr_,&len);
		if(0 == err) {
			this->onNewConn_(shared_from_this(),fd_,Addr::MakeBySockAddr(&addr_,len));
		} else {
			if(err == EAGAIN) {
				std::lock_guard<std::mutex> guard(this->mtx);
				if(localVer == this->readableVer) {
					this->doing = false;
					break;
				}
			} else {
				if(nullptr != this->onError_){
					this->onError_(shared_from_this(),err);
					break;
				}
			}
		}
		if(this->stop.load() == true) {
			break;
		}
	}
}